

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O1

void __thiscall
wabt::OptionParser::AddOption
          (OptionParser *this,char short_name,char *long_name,char *metavar,char *help,
          Callback *callback)

{
  Option option;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  string local_120;
  string local_100;
  string local_e0;
  Option local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,long_name,&local_121);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,metavar,&local_122);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,help,&local_123);
  Option::Option(&local_c0,short_name,&local_120,&local_e0,Yes,&local_100,callback);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>>::
  emplace_back<wabt::OptionParser::Option_const&>
            ((vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>> *)
             &this->options_,&local_c0);
  if (local_c0.callback.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_c0.callback.super__Function_base._M_manager)
              ((_Any_data *)&local_c0.callback,(_Any_data *)&local_c0.callback,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.help._M_dataplus._M_p != &local_c0.help.field_2) {
    operator_delete(local_c0.help._M_dataplus._M_p,local_c0.help.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.metavar._M_dataplus._M_p != &local_c0.metavar.field_2) {
    operator_delete(local_c0.metavar._M_dataplus._M_p,
                    local_c0.metavar.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.long_name._M_dataplus._M_p != &local_c0.long_name.field_2) {
    operator_delete(local_c0.long_name._M_dataplus._M_p,
                    local_c0.long_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void OptionParser::AddOption(char short_name,
                             const char* long_name,
                             const char* metavar,
                             const char* help,
                             const Callback& callback) {
  Option option(short_name, long_name, metavar, HasArgument::Yes, help,
                callback);
  AddOption(option);
}